

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void prepcallclosemth(lua_State *L,StkId level,int status,int yy)

{
  StkId local_30;
  TValue *errobj;
  TValue *uv;
  int yy_local;
  int status_local;
  StkId level_local;
  lua_State *L_local;
  
  if (status == -1) {
    local_30 = (StkId)&L->l_G->nilvalue;
  }
  else {
    local_30 = level + 1;
    luaD_seterrorobj(L,status,level + 1);
  }
  callclosemethod(L,&level->val,&local_30->val,yy);
  return;
}

Assistant:

static void prepcallclosemth (lua_State *L, StkId level, int status, int yy) {
  TValue *uv = s2v(level);  /* value being closed */
  TValue *errobj;
  if (status == CLOSEKTOP)
    errobj = &G(L)->nilvalue;  /* error object is nil */
  else {  /* 'luaD_seterrorobj' will set top to level + 2 */
    errobj = s2v(level + 1);  /* error object goes after 'uv' */
    luaD_seterrorobj(L, status, level + 1);  /* set error object */
  }
  callclosemethod(L, uv, errobj, yy);
}